

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_Mesh::Cleanup(ON_Mesh *this,bool bRemoveNgons)

{
  Cleanup(this,bRemoveNgons,true,true);
  return;
}

Assistant:

void ON_Mesh::Cleanup(bool bRemoveNgons)
{
  const bool bRemoveDegenerateFaces = true;
  const bool bCompact = true;
  Cleanup(
    bRemoveNgons,
    bRemoveDegenerateFaces,
    bCompact
    );
}